

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O3

void ELFIO::dump::note(ostream *out,int no,Elf_Word type,string *name,void *desc,Elf_Word descsz)

{
  note_values_t *pnVar1;
  ostream *poVar2;
  note_tag_t *pnVar3;
  __normal_iterator<const_ELFIO::note_tag_t::note_values_t_*,_std::vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>_>
  _Var4;
  ostream *poVar5;
  long lVar6;
  Elf_Word i;
  ulong uVar7;
  Elf_Word local_3c;
  note_values_t *local_38;
  
  local_3c = type;
  std::__ostream_insert<char,std::char_traits<char>>(out,"  [",3);
  lVar6 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = 2;
  poVar2 = out + *(long *)(lVar6 + -0x18);
  if (out[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar6 = *(long *)out;
  }
  poVar2[0xe0] = (ostream)0x20;
  *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,no);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
  pnVar3 = std::
           __find_if<ELFIO::note_tag_t_const*,__gnu_cxx::__ops::_Iter_pred<ELFIO::dump::note(std::ostream&,int,unsigned_int,std::__cxx11::string_const&,void*,unsigned_int)::_lambda(ELFIO::note_tag_t_const&)_1_>>
                     (&note_tag_table,&_end,name);
  if (pnVar3 != (note_tag_t *)&_end) {
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<ELFIO::note_tag_t::note_values_t_const*,std::vector<ELFIO::note_tag_t::note_values_t,std::allocator<ELFIO::note_tag_t::note_values_t>>>,__gnu_cxx::__ops::_Iter_pred<ELFIO::dump::note(std::ostream&,int,unsigned_int,std::__cxx11::string_const&,void*,unsigned_int)::_lambda(ELFIO::note_tag_t::note_values_t_const&)_1_>>
                      ((pnVar3->values).
                       super__Vector_base<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pnVar3->values).
                       super__Vector_base<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_3c);
    if (_Var4._M_current !=
        (pnVar3->values).
        super__Vector_base<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar6 = *(long *)out;
      *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = 0xc;
      poVar2 = out + *(long *)(lVar6 + -0x18);
      local_38 = _Var4._M_current;
      if (out[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar2);
        poVar2[0xe1] = (ostream)0x1;
        lVar6 = *(long *)out;
      }
      poVar2[0xe0] = (ostream)0x20;
      *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x20;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(pnVar3->name)._M_dataplus._M_p,(pnVar3->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
      lVar6 = *(long *)poVar5;
      *(undefined8 *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x10) = 8;
      poVar2 = poVar5 + *(long *)(lVar6 + -0x18);
      if (poVar5[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar2);
        poVar2[0xe1] = (ostream)0x1;
        lVar6 = *(long *)poVar5;
      }
      poVar2[0xe0] = (ostream)0x30;
      *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x80;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      pnVar1 = local_38;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(local_38->type_str)._M_dataplus._M_p,
                          (local_38->type_str)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(pnVar1->description)._M_dataplus._M_p,
                          (pnVar1->description)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      goto LAB_0011429e;
    }
  }
  lVar6 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = 0xc;
  poVar2 = out + *(long *)(lVar6 + -0x18);
  if (out[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar6 = *(long *)out;
  }
  poVar2[0xe0] = (ostream)0x20;
  *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x20;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
  lVar6 = *(long *)poVar5;
  *(undefined8 *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x10) = 8;
  poVar2 = poVar5 + *(long *)(lVar6 + -0x18);
  if (poVar5[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar6 = *(long *)poVar5;
  }
  poVar2[0xe0] = (ostream)0x30;
  *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
  lVar6 = *(long *)poVar5;
  *(undefined8 *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x10) = 8;
  poVar2 = poVar5 + *(long *)(lVar6 + -0x18);
  if (poVar5[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar6 = *(long *)poVar5;
  }
  poVar2[0xe0] = (ostream)0x30;
  *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
LAB_0011429e:
  if (descsz != 0) {
    uVar7 = 0;
    do {
      if ((uVar7 & 0xf) == 0) {
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
        std::ostream::put((char)out);
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"         ",9);
      }
      lVar6 = *(long *)out;
      *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = 2;
      poVar2 = out + *(long *)(lVar6 + -0x18);
      if (out[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar2);
        poVar2[0xe1] = (ostream)0x1;
        lVar6 = *(long *)out;
      }
      poVar2[0xe0] = (ostream)0x30;
      *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x80;
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      uVar7 = uVar7 + 1;
    } while (descsz != uVar7);
  }
  return;
}

Assistant:

static void note( std::ostream&      out,
                      int                no,
                      Elf_Word           type,
                      const std::string& name,
                      void*              desc,
                      Elf_Word           descsz )
    {
        out << "  [" << DUMP_DEC_FORMAT( 2 ) << no << "] ";

        const auto name_group = std::find_if(
            std::begin( note_tag_table ), std::end( note_tag_table ),
            [&name]( const note_tag_t& entry ) { return entry.name == name; } );

        std::vector<note_tag_t::note_values_t>::const_iterator type_value;
        if ( name_group != std::end( note_tag_table ) ) {
            type_value = std::find_if(
                name_group->values.begin(), name_group->values.end(),
                [&type]( const note_tag_t::note_values_t& e ) {
                    return e.type == type;
                } );
        }

        if ( name_group != std::end( note_tag_table ) &&
             type_value != name_group->values.end() ) {
            out << DUMP_STR_FORMAT( 12 ) << name_group->name << " "
                << DUMP_HEX0x_FORMAT( 8 ) << descsz << " "
                << type_value->type_str << " (" << type_value->description
                << ")";
        }
        else {
            out << DUMP_STR_FORMAT( 12 ) << name << " "
                << DUMP_HEX0x_FORMAT( 8 ) << descsz << " "
                << DUMP_HEX0x_FORMAT( 8 ) << type;
        }

        if ( descsz != 0 ) {
            for ( Elf_Word i = 0; i < descsz; ++i ) {
                if ( i % 16 == 0 ) {
                    out << std::endl << "         ";
                }
                out << DUMP_HEX_FORMAT( 2 )
                    << (uint32_t)( (uint8_t*)( desc ) )[i];
            }
        }
    }